

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_impl_mul(secp256k1_fe *r,secp256k1_fe *a,secp256k1_fe *b)

{
  uint64_t *in_stack_00000060;
  uint64_t *in_stack_00000068;
  uint64_t *in_stack_00000070;
  
  secp256k1_fe_mul_inner(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_impl_mul(secp256k1_fe *r, const secp256k1_fe *a, const secp256k1_fe * SECP256K1_RESTRICT b) {
    secp256k1_fe_mul_inner(r->n, a->n, b->n);
}